

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

void test_io(void)

{
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_28,
             "(and (port? console-i/o-port) (i/o-port? console-i/o-port) (input-port? (current-input-port)) (output-port? (current-output-port)))"
             ,&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"#t",&local_61);
  run_test(&local_28,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,
             "(define s (open-input-string \"qwe\\nrty\\nuio\")) (close-all-open-files) (read-line s) (equal? (read-line s) \"rty\")"
             ,&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"#t",&local_b1);
  run_test(&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,
             "(define s (open-output-string)) (close-all-open-files) (display \'qwe s) (newline s) (equal? (get-output-string s) \"qwe\\n\")"
             ,&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"#t",&local_101);
  run_test(&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_128,
             "(equal? (with-input-from-string \"(a b c) (d e f)\" read) \'(a b c))",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"#t",&local_151);
  run_test(&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,
             "(equal? (call-with-output-string (lambda (p) (display 42 p))) \"42\")",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"#t",&local_1a1);
  run_test(&local_178,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,
             "(define i (open-input-string \"qwe rty\")) (define o (open-output-string)) (set-current-input-port! i) (set-current-output-port! o) (write (read-char)) (equal? (get-output-string o) \"#\\\\q\")"
             ,&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"#t",&local_1f1);
  run_test(&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_218,
             "(equal? (with-output-to-string (lambda () (write \'abc))) \"abc\")",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"#t",&local_241);
  run_test(&local_218,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,"(equal? (write-to-string \"1 2 3\") \"\\\"1 2 3\\\"\")",
             &local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"#t",&local_291);
  run_test(&local_268,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b8,"(equal? (write-to-string \'\'(a b c)) \"\'(a b c)\")",&local_2b9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"#t",&local_2e1);
  run_test(&local_2b8,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_308,"(equal? (write-to-string \'(quote . 1)) \"(quote . 1)\")",
             &local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"#t",&local_331);
  run_test(&local_308,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_358,
             "(equal? (with-input-from-string \"qw\" (lambda () (list (peek-char) (read-char) (read-char) (peek-char) (read-char)))) \'(#\\q #\\q #\\w eof eof))"
             ,&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"#t",&local_381);
  run_test(&local_358,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  return;
}

Assistant:

static void test_io()
{
    run_test("(and (port? console-i/o-port) (i/o-port? console-i/o-port) (input-port? (current-input-port)) "
             "(output-port? (current-output-port)))", "#t");
    run_test("(define s (open-input-string \"qwe\\nrty\\nuio\")) (close-all-open-files) (read-line s) "
             "(equal? (read-line s) \"rty\")", "#t");
    run_test("(define s (open-output-string)) (close-all-open-files) (display 'qwe s) (newline s) "
             "(equal? (get-output-string s) \"qwe\\n\")", "#t");
    run_test("(equal? (with-input-from-string \"(a b c) (d e f)\" read) '(a b c))", "#t");
    run_test("(equal? (call-with-output-string (lambda (p) (display 42 p))) \"42\")", "#t");
    run_test("(define i (open-input-string \"qwe rty\")) (define o (open-output-string)) (set-current-input-port! i) "
             "(set-current-output-port! o) (write (read-char)) (equal? (get-output-string o) \"#\\\\q\")", "#t");
    run_test("(equal? (with-output-to-string (lambda () (write 'abc))) \"abc\")", "#t");
    run_test("(equal? (write-to-string \"1 2 3\") \"\\\"1 2 3\\\"\")", "#t");
    run_test("(equal? (write-to-string ''(a b c)) \"'(a b c)\")", "#t");
    run_test("(equal? (write-to-string '(quote . 1)) \"(quote . 1)\")", "#t");
    run_test("(equal? (with-input-from-string \"qw\" (lambda () "
             "(list (peek-char) (read-char) (read-char) (peek-char) (read-char)))) '(#\\q #\\q #\\w eof eof))", "#t");
}